

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall yactfr::internal::JsonDstFragValReq::JsonDstFragValReq(JsonDstFragValReq *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  __l;
  char *pcVar1;
  bool isRequired;
  bool isRequired_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_380;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  local_305;
  key_equal local_304;
  hasher local_303;
  undefined1 local_302;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  JsonValKind local_28c;
  type local_288;
  undefined1 local_280 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_250;
  PropReqsEntry local_218;
  PropReqsEntry local_1e0;
  undefined1 local_1a8 [56];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_170;
  PropReqsEntry local_138;
  PropReqsEntry local_100;
  PropReqsEntry local_c8;
  iterator local_90;
  size_type local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  local_80;
  allocator local_31;
  string local_30;
  JsonDstFragValReq *local_10;
  JsonDstFragValReq *this_local;
  
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_007e03e0;
  local_10 = this;
  pcVar1 = typeStr();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  local_302 = 1;
  local_258 = &local_250;
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  local_258 = &local_218;
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (local_258,(_anonymous_namespace_ *)0x0,isRequired);
  local_258 = &local_1e0;
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_258,(_anonymous_namespace_ *)0x0,isRequired_00);
  local_258 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)local_1a8;
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  local_28c = Str;
  local_258 = &local_170;
  boost::optional<yactfr::internal::JsonValKind>::optional
            ((optional<yactfr::internal::JsonValKind> *)&local_288,&local_28c);
  JsonValReq::shared((JsonValReq *)local_280,(optional<yactfr::internal::JsonValKind>)local_288,
                     false);
  JsonObjValPropReq::JsonObjValPropReq
            ((JsonObjValPropReq *)(local_280 + 0x10),(Sp *)local_280,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>
            (&local_170,&strs::defCcId,(JsonObjValPropReq *)(local_280 + 0x10));
  local_258 = &local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"packet-context-field-class",&local_2b1);
  anon_unknown_0::anyDtPropReqEntry(&local_138,&local_2b0,&this->_anyFullDtValReq,false);
  local_258 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"event-record-header-field-class",&local_2d9);
  anon_unknown_0::anyDtPropReqEntry(&local_100,&local_2d8,&this->_anyFullDtValReq,false);
  local_258 = &local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_300,"event-record-common-context-field-class",&local_301);
  anon_unknown_0::anyDtPropReqEntry(&local_c8,&local_300,&this->_anyFullDtValReq,false);
  local_302 = 0;
  local_90 = &local_250;
  local_88 = 8;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::allocator(&local_305);
  __l._M_len = local_88;
  __l._M_array = local_90;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map(&local_80,__l,0,&local_303,&local_304,&local_305);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_30,&local_80);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map(&local_80);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::~allocator(&local_305);
  local_380 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)&local_90;
  do {
    local_380 = local_380 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair(local_380);
  } while (local_380 != &local_250);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  JsonObjValPropReq::~JsonObjValPropReq((JsonObjValPropReq *)(local_280 + 0x10));
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr
            ((shared_ptr<const_yactfr::internal::JsonValReq> *)local_280);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_007e03e0;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(&this->_anyFullDtValReq);
  return;
}

Assistant:

explicit JsonDstFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::defCcId, {JsonValReq::shared(JsonVal::Kind::Str)}},
            anyDtPropReqEntry(strs::pktCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erHeaderFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erCommonCtxFc, _anyFullDtValReq), //-V1050
        }}
    {
    }